

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O0

bool __thiscall rsg::VariableType::Member::operator!=(Member *this,Member *other)

{
  bool bVar1;
  Member *other_local;
  Member *this_local;
  
  bVar1 = std::operator!=(&this->m_name,&other->m_name);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else if ((this->m_type != (VariableType *)0x0) == (other->m_type != (VariableType *)0x0)) {
    if ((this->m_type == (VariableType *)0x0) ||
       (bVar1 = VariableType::operator!=(this->m_type,other->m_type), !bVar1)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator!= (const Member& other) const
		{
			if (m_name != other.m_name)
				return true;
			if (!!m_type != !!other.m_type)
				return true;
			if (m_type && *m_type != *other.m_type)
				return true;
			return false;
		}